

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O3

void __thiscall FPolyObj::ClosestPoint(FPolyObj *this,DVector2 *fpos,DVector2 *out,side_t **side)

{
  side_t *psVar1;
  line_t_conflict *plVar2;
  double dVar3;
  double dVar4;
  ulong uVar5;
  side_t *psVar6;
  ulong uVar7;
  bool bVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  
  uVar5 = (ulong)(this->Sidedefs).Count;
  if (uVar5 == 0) {
    psVar6 = (side_t *)0x0;
    dVar10 = 0.0;
    dVar11 = 0.0;
  }
  else {
    dVar10 = 0.0;
    dVar11 = 0.0;
    dVar9 = INFINITY;
    uVar7 = 0;
    psVar6 = (side_t *)0x0;
    do {
      psVar1 = (this->Sidedefs).Array[uVar7];
      plVar2 = psVar1->linedef;
      bVar8 = plVar2->sidedef[0] == psVar1;
      dVar15 = **(double **)(plVar2->args + (ulong)bVar8 * 2 + -0xb);
      dVar17 = (*(double **)(plVar2->args + (ulong)bVar8 * 2 + -0xb))[1];
      dVar3 = **(double **)(plVar2->args + (ulong)!bVar8 * 2 + -0xb);
      dVar4 = (*(double **)(plVar2->args + (ulong)!bVar8 * 2 + -0xb))[1];
      dVar14 = dVar15 - dVar3;
      dVar16 = dVar17 - dVar4;
      dVar18 = dVar16 * dVar16 + dVar14 * dVar14;
      dVar12 = dVar3;
      dVar13 = dVar4;
      if ((((dVar18 != 0.0) || (NAN(dVar18))) &&
          (dVar18 = ((fpos->Y - dVar4) * dVar16 + (fpos->X - dVar3) * dVar14) / dVar18, 0.0 < dVar18
          )) && (dVar12 = dVar15, dVar13 = dVar17, dVar18 < 1.0)) {
        dVar12 = dVar3 + dVar14 * dVar18;
        dVar13 = dVar4 + dVar16 * dVar18;
      }
      dVar15 = dVar12 - fpos->X;
      dVar17 = dVar13 - fpos->Y;
      dVar15 = dVar17 * dVar17 + dVar15 * dVar15;
      if (dVar9 <= dVar15) {
        dVar15 = dVar9;
        psVar1 = psVar6;
        dVar13 = dVar11;
        dVar12 = dVar10;
      }
      dVar10 = dVar12;
      dVar11 = dVar13;
      psVar6 = psVar1;
      dVar9 = dVar15;
      uVar7 = uVar7 + 1;
    } while (uVar5 != uVar7);
  }
  out->X = dVar10;
  out->Y = dVar11;
  if (side != (side_t **)0x0) {
    *side = psVar6;
  }
  return;
}

Assistant:

void FPolyObj::ClosestPoint(const DVector2 &fpos, DVector2 &out, side_t **side) const
{
	unsigned int i;
	double x = fpos.X, y = fpos.Y;
	double bestdist = HUGE_VAL;
	double bestx = 0, besty = 0;
	side_t *bestline = NULL;

	for (i = 0; i < Sidedefs.Size(); ++i)
	{
		vertex_t *v1 = Sidedefs[i]->V1();
		vertex_t *v2 = Sidedefs[i]->V2();
		double a = v2->fX() - v1->fX();
		double b = v2->fY() - v1->fY();
		double den = a*a + b*b;
		double ix, iy, dist;

		if (den == 0)
		{ // Line is actually a point!
			ix = v1->fX();
			iy = v1->fY();
		}
		else
		{
			double num = (x - v1->fX()) * a + (y - v1->fY()) * b;
			double u = num / den;
			if (u <= 0)
			{
				ix = v1->fX();
				iy = v1->fY();
			}
			else if (u >= 1)
			{
				ix = v2->fX();
				iy = v2->fY();
			}
			else
			{
				ix = v1->fX() + u * a;
				iy = v1->fY() + u * b;
			}
		}
		a = (ix - x);
		b = (iy - y);
		dist = a*a + b*b;
		if (dist < bestdist)
		{
			bestdist = dist;
			bestx = ix;
			besty = iy;
			bestline = Sidedefs[i];
		}
	}
	out = { bestx, besty };
	if (side != NULL)
	{
		*side = bestline;
	}
}